

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

CommandSignature __thiscall
anon_unknown.dwarf_643cf::SymlinkCommand::getSignature(SymlinkCommand *this)

{
  BuildNode *pBVar1;
  pointer ppBVar2;
  StringRef string;
  CommandSignature *pCVar3;
  size_t in_RDX;
  pointer ppBVar4;
  StringRef S;
  CommandSignature local_20;
  
  pBVar1 = *(this->super_Command).outputs.
            super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  S.Length = in_RDX;
  S.Data = (char *)(pBVar1->super_Node).name._M_string_length;
  local_20.value = (uint64_t)llvm::hash_value((llvm *)(pBVar1->super_Node).name._M_dataplus._M_p,S);
  pCVar3 = llbuild::basic::CommandSignature::combine(&local_20,&this->contents);
  local_20.value = pCVar3->value;
  ppBVar2 = (this->super_Command).inputs.
            super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppBVar4 = (this->super_Command).inputs.
                 super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppBVar4 != ppBVar2;
      ppBVar4 = ppBVar4 + 1) {
    string.Data = ((*ppBVar4)->super_Node).name._M_dataplus._M_p;
    string.Length = ((*ppBVar4)->super_Node).name._M_string_length;
    pCVar3 = llbuild::basic::CommandSignature::combine(&local_20,string);
    local_20.value = pCVar3->value;
  }
  return (CommandSignature)local_20.value;
}

Assistant:

virtual CommandSignature getSignature() const override {
    CommandSignature code(outputs[0]->getName());
    code = code.combine(contents);
    for (const auto* input: inputs) {
      code = code.combine(input->getName());
    }
    return code;
  }